

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

int __thiscall EvaluatorMopUp::Evaluate(EvaluatorMopUp *this,Position *pos)

{
  int iVar1;
  BoardBase *this_00;
  Piece *pPVar2;
  float fVar3;
  Piece *pPiece;
  Square cur;
  uint j;
  uint i;
  Square localBlackKing;
  Square localWhiteKing;
  float fTurnOnAt;
  Position *pos_local;
  EvaluatorMopUp *this_local;
  
  fVar3 = Position::GetPhase(pos);
  if (0.9 <= fVar3) {
    Square::Square(&localBlackKing);
    Square::Square((Square *)&j);
    for (cur.j = 0; (uint)cur.j < 8; cur.j = cur.j + 1) {
      for (cur.i = 0; (uint)cur.i < 8; cur.i = cur.i + 1) {
        Square::Square((Square *)((long)&pPiece + 4),cur.j,cur.i);
        this_00 = (BoardBase *)Position::GetBoard(pos);
        pPVar2 = BoardBase::Get(this_00,(Square *)((long)&pPiece + 4));
        if (pPVar2 == &WhiteKing.super_Piece) {
          localBlackKing = stack0xffffffffffffffbc;
        }
        if (pPVar2 == &BlackKing.super_Piece) {
          _j = stack0xffffffffffffffbc;
        }
      }
    }
    iVar1 = Square::ManhattanDistanceTo(&localBlackKing,(Square *)&j);
    this_local._4_4_ =
         (*(this->super_EvaluatorBase)._vptr_EvaluatorBase[1])
                   (this,pos,(ulong)(uint)((6 - iVar1) * 100));
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

virtual int Evaluate( Position &pos ) const
    {
        const float fTurnOnAt = 0.9f;

        if ( pos.GetPhase() < fTurnOnAt )
            return 0;

        Square localWhiteKing, localBlackKing;

        for ( unsigned int i = 0; i < MAX_FILES; i++ )
        {
            for ( unsigned int j = 0; j < MAX_FILES; j++ )
            {
                Square cur( i, j );
                const Piece *pPiece = pos.GetBoard().Get( cur );

                if ( pPiece == &WhiteKing )
                    localWhiteKing = cur;

                if ( pPiece == &BlackKing )
                    localBlackKing = cur;
            }
        }

        return Bias( pos, ( 6 - localWhiteKing.ManhattanDistanceTo(
                                localBlackKing ) ) * 100 );
    }